

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_wrapper.hpp
# Opt level: O1

PyObject *
boost::python::objects::
class_cref_wrapper<HFParsingInfo,_boost::python::objects::make_instance<HFParsingInfo,_boost::python::objects::value_holder<HFParsingInfo>_>_>
::convert(HFParsingInfo *x)

{
  long lVar1;
  PyObject *self;
  decref_guard protect;
  decref_guard local_20;
  
  lVar1 = converter::registration::get_class_object
                    (converter::detail::registered_base<HFParsingInfo_const_volatile&>::converters);
  if (lVar1 == 0) {
    self = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  else {
    self = (PyObject *)(**(code **)(lVar1 + 0x130))(lVar1,0x50);
    if (self != (PyObject *)0x0) {
      local_20.obj = self;
      value_holder<HFParsingInfo>::value_holder<boost::reference_wrapper<HFParsingInfo_const>>
                ((value_holder<HFParsingInfo> *)(self + 3),self,
                 (reference_wrapper<const_HFParsingInfo>)x);
      instance_holder::install((instance_holder *)(self + 3),self);
      self[1].ob_refcnt = 0x30;
      local_20.obj = (PyObject *)0x0;
      python::detail::decref_guard::~decref_guard(&local_20);
    }
  }
  return self;
}

Assistant:

static PyObject* convert(Src const& x)
    {
        return MakeInstance::execute(boost::ref(x));
    }